

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QStandardItem_*,_QHashDummyValue>_>::rehash
          (Data<QHashPrivate::Node<QStandardItem_*,_QHashDummyValue>_> *this,size_t sizeHint)

{
  Entry *key;
  uchar *puVar1;
  ulong uVar2;
  Span *pSVar3;
  QStandardItem *pQVar4;
  Node<QStandardItem_*,_QHashDummyValue> *pNVar5;
  ulong uVar6;
  ulong uVar7;
  size_t index;
  long lVar8;
  size_t numBuckets;
  Span *pSVar9;
  long lVar10;
  R RVar11;
  Bucket BVar12;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar8 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar8 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar11 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar11.spans;
  this->numBuckets = numBuckets;
  if (uVar2 < 0x80) {
    if (pSVar3 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar6 = 0;
    pSVar9 = pSVar3;
    do {
      lVar8 = 0;
      do {
        if ((ulong)pSVar9->offsets[lVar8] != 0xff) {
          key = pSVar3[uVar6].entries + pSVar9->offsets[lVar8];
          pQVar4 = *(QStandardItem **)(key->storage).data;
          uVar7 = ((ulong)pQVar4 >> 0x20 ^ (ulong)pQVar4) * -0x2917014799a6026d;
          uVar7 = (uVar7 >> 0x20 ^ uVar7) * -0x2917014799a6026d;
          BVar12 = Data<QHashPrivate::Node<QStandardItem*,QHashDummyValue>>::
                   findBucketWithHash<QStandardItem*>
                             ((Data<QHashPrivate::Node<QStandardItem*,QHashDummyValue>> *)this,
                              (QStandardItem **)key,uVar7 >> 0x20 ^ this->seed ^ uVar7);
          pNVar5 = Span<QHashPrivate::Node<QStandardItem_*,_QHashDummyValue>_>::insert
                             (BVar12.span,BVar12.index);
          pNVar5->key = *(QStandardItem **)(key->storage).data;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x80);
      if (pSVar3[uVar6].entries != (Entry *)0x0) {
        operator_delete__(pSVar3[uVar6].entries);
        pSVar3[uVar6].entries = (Entry *)0x0;
      }
      uVar6 = uVar6 + 1;
      pSVar9 = pSVar9 + 1;
    } while (uVar6 != uVar2 >> 7);
  }
  lVar8 = *(long *)&pSVar3[-1].allocated;
  if (lVar8 != 0) {
    lVar10 = lVar8 * 0x90;
    do {
      if (*(void **)(pSVar3->offsets + lVar10 + -0x10) != (void *)0x0) {
        operator_delete__(*(void **)(pSVar3->offsets + lVar10 + -0x10));
        puVar1 = pSVar3->offsets + lVar10 + -0x10;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
      }
      lVar10 = lVar10 + -0x90;
    } while (lVar10 != 0);
  }
  operator_delete__(&pSVar3[-1].allocated,lVar8 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }